

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_throw(lua_State *L,TStatus errcode)

{
  lua_longjmp *plVar1;
  global_State *pgVar2;
  StkId pSVar3;
  long lVar4;
  TStatus errcode_00;
  
  plVar1 = L->errorJmp;
  if (plVar1 != (lua_longjmp *)0x0) {
    plVar1->status = errcode;
    longjmp((__jmp_buf_tag *)plVar1->b,1);
  }
  pgVar2 = L->l_G;
  errcode_00 = luaE_resetthread(L,errcode);
  L->status = errcode_00;
  if ((pgVar2->mainth).l.errorJmp == (lua_longjmp *)0x0) {
    if (pgVar2->panic != (lua_CFunction)0x0) {
      (*pgVar2->panic)(L);
    }
    abort();
  }
  pSVar3 = (pgVar2->mainth).l.top.p;
  (pgVar2->mainth).l.top.p = pSVar3 + 1;
  lVar4 = (L->top).offset;
  (pSVar3->val).value_ = *(Value *)(lVar4 + -0x10);
  (pSVar3->val).tt_ = *(lu_byte *)(lVar4 + -8);
  luaD_throw(&(pgVar2->mainth).l,errcode_00);
}

Assistant:

l_noret luaD_throw (lua_State *L, TStatus errcode) {
  if (L->errorJmp) {  /* thread has an error handler? */
    L->errorJmp->status = errcode;  /* set status */
    LUAI_THROW(L, L->errorJmp);  /* jump to it */
  }
  else {  /* thread has no error handler */
    global_State *g = G(L);
    lua_State *mainth = mainthread(g);
    errcode = luaE_resetthread(L, errcode);  /* close all upvalues */
    L->status = errcode;
    if (mainth->errorJmp) {  /* main thread has a handler? */
      setobjs2s(L, mainth->top.p++, L->top.p - 1);  /* copy error obj. */
      luaD_throw(mainth, errcode);  /* re-throw in main thread */
    }
    else {  /* no handler at all; abort */
      if (g->panic) {  /* panic function? */
        lua_unlock(L);
        g->panic(L);  /* call panic function (last chance to jump out) */
      }
      abort();
    }
  }
}